

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Scatter_acc64(int g_a,void *v,int64_t **subsArray,int64_t n,void *alpha)

{
  pnga_scatter_acc((long)g_a,v,subsArray,1,n,alpha);
  return;
}

Assistant:

void NGA_Scatter_acc64(int g_a, void *v, int64_t* subsArray[], int64_t n, void *alpha)
{
    int64_t idx;
    int i;
    Integer a = (Integer)g_a;
    Integer nv = (Integer)n;
#ifndef USE_GATSCAT_NEW
    Integer ndim = wnga_ndim(a);
    Integer *_subs_array;
    _subs_array = (Integer *)malloc((int)ndim* n * sizeof(Integer));
    if(_subs_array == NULL) GA_Error("Memory allocation failed.", 0);
    for(idx=0; idx<n; idx++)
        for(i=0; i<ndim; i++)
            _subs_array[idx*ndim+(ndim-i-1)] = subsArray[idx][i] + 1;
    wnga_scatter_acc(a, v, _subs_array, 0, nv, alpha);
    free(_subs_array);
#else
    wnga_scatter_acc(a, v, subsArray, 1, nv, alpha);
#endif
}